

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O2

REF_STATUS ref_swap_tri_pass(REF_GRID ref_grid)

{
  int *piVar1;
  REF_INT node0;
  int node1;
  int iVar2;
  REF_CELL ref_cell;
  REF_INT *pRVar3;
  REF_INT RVar4;
  REF_GRID pRVar5;
  long lVar6;
  uint uVar7;
  undefined8 uVar8;
  REF_STATUS RVar9;
  ulong uVar10;
  char *pcVar11;
  long lVar12;
  REF_BOOL allowed;
  REF_INT node2_1;
  REF_BOOL pyr_side;
  REF_GRID local_f8;
  REF_BOOL pri_side;
  REF_INT local_ec;
  long local_e8;
  REF_INT local_e0;
  REF_INT local_dc;
  REF_BOOL has_tri;
  REF_BOOL has_edg;
  REF_INT local_d0;
  REF_INT node3_1;
  REF_NODE local_c8;
  REF_NODE local_c0;
  long local_b8;
  REF_EDGE ref_edge;
  REF_BOOL qua_side;
  REF_INT local_a4;
  REF_INT local_a0;
  
  local_c0 = ref_grid->node;
  if ((ref_grid->surf == 0) && (ref_grid->twod == 0)) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x2de,
           "ref_swap_tri_pass","only twod/surf");
    RVar9 = 1;
  }
  else {
    uVar7 = ref_edge_create(&ref_edge,ref_grid);
    if (uVar7 == 0) {
      lVar12 = 0;
      local_f8 = ref_grid;
LAB_001d26a8:
      if (ref_edge->n <= lVar12) {
        ref_edge_free(ref_edge);
        return 0;
      }
      node0 = ref_edge->e2n[lVar12 * 2];
      node1 = ref_edge->e2n[lVar12 * 2 + 1];
      uVar7 = ref_cell_has_side(local_f8->cell[0],node0,node1,&has_edg);
      if (uVar7 != 0) {
        uVar10 = (ulong)uVar7;
        pcVar11 = "has edg";
        uVar8 = 0x2e6;
        goto LAB_001d267d;
      }
      if (has_edg != 0) goto LAB_001d26ed;
      uVar7 = ref_cell_has_side(local_f8->cell[3],node0,node1,&has_tri);
      pRVar5 = local_f8;
      if (uVar7 != 0) {
        uVar10 = (ulong)uVar7;
        pcVar11 = "still triangle side";
        uVar8 = 0x2ea;
        goto LAB_001d267d;
      }
      if (has_tri != 0) {
        local_b8 = (long)node0;
        iVar2 = local_c0->ref_mpi->id;
        if ((iVar2 == local_c0->part[local_b8]) || (iVar2 == local_c0->part[node1])) {
          local_e8 = (long)node1;
          uVar7 = ref_cell_has_side(local_f8->cell[6],node0,node1,&qua_side);
          if (uVar7 == 0) {
            uVar7 = ref_cell_has_side(pRVar5->cell[10],node0,node1,&pri_side);
            if (uVar7 == 0) {
              uVar7 = ref_cell_has_side(pRVar5->cell[9],node0,node1,&pyr_side);
              if (uVar7 == 0) {
                uVar7 = ref_cell_has_side(pRVar5->cell[0xb],node0,node1,&node2_1);
                lVar6 = local_e8;
                if (uVar7 == 0) {
                  allowed = (REF_BOOL)
                            (((pri_side == 0 && qua_side == 0) && pyr_side == 0) && node2_1 == 0);
                  if (((pri_side != 0 || qua_side != 0) || pyr_side != 0) || node2_1 != 0)
                  goto LAB_001d26ed;
                  uVar7 = ref_swap_same_faceid(local_f8,node0,node1,&allowed);
                  if (uVar7 != 0) {
                    uVar10 = (ulong)uVar7;
                    pcVar11 = "faceid";
                    uVar8 = 0x2f3;
                    goto LAB_001d267d;
                  }
                  if (allowed == 0) goto LAB_001d26ed;
                  uVar7 = ref_swap_manifold(local_f8,node0,node1,&allowed);
                  if (uVar7 != 0) {
                    uVar10 = (ulong)uVar7;
                    pcVar11 = "manifold";
                    uVar8 = 0x2f5;
                    goto LAB_001d267d;
                  }
                  if (allowed == 0) goto LAB_001d26ed;
                  uVar7 = ref_swap_geom_topo(local_f8,node0,node1,&allowed);
                  if (uVar7 != 0) {
                    uVar10 = (ulong)uVar7;
                    pcVar11 = "topo";
                    uVar8 = 0x2f7;
                    goto LAB_001d267d;
                  }
                  if (allowed == 0) goto LAB_001d26ed;
                  uVar7 = ref_swap_quality(local_f8,node0,node1,&allowed);
                  if (uVar7 != 0) {
                    uVar10 = (ulong)uVar7;
                    pcVar11 = "qual";
                    uVar8 = 0x2f9;
                    goto LAB_001d267d;
                  }
                  if (allowed == 0) goto LAB_001d26ed;
                  uVar7 = ref_swap_ratio(local_f8,node0,node1,&allowed);
                  if (uVar7 != 0) {
                    uVar10 = (ulong)uVar7;
                    pcVar11 = "ratio";
                    uVar8 = 0x2fb;
                    goto LAB_001d267d;
                  }
                  if (allowed == 0) goto LAB_001d26ed;
                  if (local_f8->surf == 0) {
                    local_c8 = local_f8->node;
                    allowed = 0;
                    uVar7 = ref_swap_node23(local_f8,node0,node1,&pri_side,&pyr_side);
                    if (uVar7 == 0) {
                      local_dc = pyr_side;
                      local_a4 = pyr_side;
                      local_e0 = pri_side;
                      local_a0 = pri_side;
                      qua_side = node0;
                      uVar7 = ref_node_tri_twod_orientation(local_c8,&qua_side,&node2_1);
                      if (uVar7 == 0) {
                        if (node2_1 != 0) {
                          local_a4 = local_e0;
                          local_a0 = local_dc;
                          qua_side = node1;
                          uVar7 = ref_node_tri_twod_orientation(local_c8,&qua_side,&node2_1);
                          if (uVar7 != 0) {
                            uVar10 = (ulong)uVar7;
                            pcVar11 = "valid";
                            uVar8 = 0x1c2;
                            goto LAB_001d2ed1;
                          }
                          if (node2_1 != 0) {
                            allowed = 1;
                            goto LAB_001d297f;
                          }
                        }
                        goto LAB_001d26ed;
                      }
                      uVar10 = (ulong)uVar7;
                      pcVar11 = "valid";
                      uVar8 = 0x1bc;
                    }
                    else {
                      uVar10 = (ulong)uVar7;
                      pcVar11 = "other nodes";
                      uVar8 = 0x1b7;
                    }
LAB_001d2ed1:
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                           ,uVar8,"ref_swap_outward_norm",uVar10,pcVar11);
                    pcVar11 = "area";
                    uVar8 = 0x301;
                    goto LAB_001d267d;
                  }
                  uVar7 = ref_swap_conforming(local_f8,node0,node1,&allowed);
                  if (uVar7 != 0) {
                    uVar10 = (ulong)uVar7;
                    pcVar11 = "normdev";
                    uVar8 = 0x2fe;
                    goto LAB_001d267d;
                  }
                  if (allowed == 0) goto LAB_001d26ed;
LAB_001d297f:
                  pRVar5 = local_f8;
                  ref_swap_local_cell(local_f8,node0,node1,&allowed);
                  if (allowed != 0) {
                    ref_cell = pRVar5->cell[3];
                    uVar7 = ref_swap_node23(pRVar5,node0,node1,&node2_1,&node3_1);
                    if (uVar7 == 0) {
                      uVar7 = ref_cell_list_with2(ref_cell,node0,node1,2,&pyr_side,&pri_side);
                      if (uVar7 != 0) {
                        uVar10 = (ulong)uVar7;
                        pcVar11 = "more then two";
                        uVar8 = 0x2b3;
                        goto LAB_001d2e7e;
                      }
                      if ((long)pyr_side == 2) {
                        uVar7 = ref_cell_nodes(ref_cell,pri_side,&qua_side);
                        if (uVar7 == 0) {
                          uVar7 = ref_cell_remove(ref_cell,pri_side);
                          if (uVar7 == 0) {
                            uVar7 = ref_cell_remove(ref_cell,local_ec);
                            RVar4 = node2_1;
                            if (uVar7 == 0) {
                              local_e8 = CONCAT44(local_e8._4_4_,node3_1);
                              local_a4 = node3_1;
                              local_a0 = node2_1;
                              qua_side = node0;
                              uVar7 = ref_cell_add(ref_cell,&qua_side,&local_d0);
                              if (uVar7 == 0) {
                                local_a4 = RVar4;
                                local_a0 = (REF_INT)local_e8;
                                qua_side = node1;
                                uVar7 = ref_cell_add(ref_cell,&qua_side,&local_d0);
                                if (uVar7 == 0) goto LAB_001d26ed;
                                uVar10 = (ulong)uVar7;
                                pcVar11 = "add node0 version";
                                uVar8 = 0x2c0;
                              }
                              else {
                                uVar10 = (ulong)uVar7;
                                pcVar11 = "add node0 version";
                                uVar8 = 700;
                              }
                            }
                            else {
                              uVar10 = (ulong)uVar7;
                              pcVar11 = "remove";
                              uVar8 = 0x2b7;
                            }
                          }
                          else {
                            uVar10 = (ulong)uVar7;
                            pcVar11 = "remove";
                            uVar8 = 0x2b6;
                          }
                        }
                        else {
                          uVar10 = (ulong)uVar7;
                          pcVar11 = "nodes tri0";
                          uVar8 = 0x2b5;
                        }
                        goto LAB_001d2e7e;
                      }
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                             ,0x2b4,"ref_swap_tri_edge","there should be two triangles for manifold"
                             ,2,(long)pyr_side);
                      uVar10 = 1;
                    }
                    else {
                      uVar10 = (ulong)uVar7;
                      pcVar11 = "other nodes";
                      uVar8 = 0x2b0;
LAB_001d2e7e:
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                             ,uVar8,"ref_swap_tri_edge",uVar10,pcVar11);
                    }
                    pcVar11 = "swap";
                    uVar8 = 0x30c;
                    goto LAB_001d267d;
                  }
                  pRVar3 = local_c0->age;
                  piVar1 = pRVar3 + local_b8;
                  *piVar1 = *piVar1 + 1;
                  piVar1 = pRVar3 + lVar6;
                  *piVar1 = *piVar1 + 1;
                  goto LAB_001d26ed;
                }
                uVar10 = (ulong)uVar7;
                pcVar11 = "hex";
                uVar8 = 0x2d1;
              }
              else {
                uVar10 = (ulong)uVar7;
                pcVar11 = "pyr";
                uVar8 = 0x2cf;
              }
            }
            else {
              uVar10 = (ulong)uVar7;
              pcVar11 = "pri";
              uVar8 = 0x2cd;
            }
          }
          else {
            uVar10 = (ulong)uVar7;
            pcVar11 = "qua";
            uVar8 = 0x2cb;
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                 uVar8,"ref_swap_edge_mixed",uVar10,pcVar11);
          pcVar11 = "faceid";
          uVar8 = 0x2f1;
          goto LAB_001d267d;
        }
      }
LAB_001d26ed:
      lVar12 = lVar12 + 1;
      goto LAB_001d26a8;
    }
    uVar10 = (ulong)uVar7;
    pcVar11 = "orig edges";
    uVar8 = 0x2e0;
LAB_001d267d:
    RVar9 = (REF_STATUS)uVar10;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",uVar8,
           "ref_swap_tri_pass",uVar10,pcVar11);
  }
  return RVar9;
}

Assistant:

REF_FCN REF_STATUS ref_swap_tri_pass(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_INT edge, node0, node1;
  REF_BOOL allowed, has_edg, has_tri;

  RAS(ref_grid_surf(ref_grid) || ref_grid_twod(ref_grid), "only twod/surf");

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);

    RSS(ref_cell_has_side(ref_grid_edg(ref_grid), node0, node1, &has_edg),
        "has edg");
    if (has_edg) continue;

    RSS(ref_cell_has_side(ref_grid_tri(ref_grid), node0, node1, &has_tri),
        "still triangle side");
    if (!has_tri) continue;

    /* skip if neither node is owned */
    if (!ref_node_owned(ref_node, node0) && !ref_node_owned(ref_node, node1))
      continue;

    RSS(ref_swap_edge_mixed(ref_grid, node0, node1, &allowed), "faceid");
    if (!allowed) continue;
    RSS(ref_swap_same_faceid(ref_grid, node0, node1, &allowed), "faceid");
    if (!allowed) continue;
    RSS(ref_swap_manifold(ref_grid, node0, node1, &allowed), "manifold");
    if (!allowed) continue;
    RSS(ref_swap_geom_topo(ref_grid, node0, node1, &allowed), "topo");
    if (!allowed) continue;
    RSS(ref_swap_quality(ref_grid, node0, node1, &allowed), "qual");
    if (!allowed) continue;
    RSS(ref_swap_ratio(ref_grid, node0, node1, &allowed), "ratio");
    if (!allowed) continue;
    if (ref_grid_surf(ref_grid)) {
      RSS(ref_swap_conforming(ref_grid, node0, node1, &allowed), "normdev");
      if (!allowed) continue;
    } else {
      RSS(ref_swap_outward_norm(ref_grid, node0, node1, &allowed), "area");
      if (!allowed) continue;
    }

    RSS(ref_swap_local_cell(ref_grid, node0, node1, &allowed), "local");
    if (!allowed) {
      ref_node_age(ref_node, node0)++;
      ref_node_age(ref_node, node1)++;
      continue;
    }

    RSS(ref_swap_tri_edge(ref_grid, node0, node1), "swap");
  }

  ref_edge_free(ref_edge);

  return REF_SUCCESS;
}